

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

Err * err_vnew(char *fmt,__va_list_tag *args)

{
  char *__s;
  Err *pEVar1;
  
  __s = (char *)malloc(0xff);
  vsnprintf(__s,0xff,fmt,args);
  pEVar1 = (Err *)malloc(0x18);
  pEVar1->desc = __s;
  pEVar1->line = -1;
  pEVar1->file = (char *)0x0;
  return pEVar1;
}

Assistant:

Err * err_vnew(char *fmt, va_list args) {
	char *desc = malloc(sizeof(char) * ERR_MAX_DESC_LEN);
	vsnprintf(desc, ERR_MAX_DESC_LEN, fmt, args);

	Err *err = malloc(sizeof(Err));
	err->desc = desc;
	err->line = -1;
	err->file = NULL;
	return err;
}